

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerHeader.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::LayerHeader::Encode(LayerHeader *this,KDataStream *stream)

{
  KDataStream::Write(stream,this->m_ui8LayerNumber);
  KDataStream::Write(stream,this->m_ui8LayerSpecificInfo);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16LayerLength);
  return;
}

Assistant:

void LayerHeader::Encode( KDataStream & stream ) const
{
    stream << m_ui8LayerNumber
           << m_ui8LayerSpecificInfo
           << m_ui16LayerLength;
}